

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

void glfwSetGamma(GLFWmonitor *handle,float gamma)

{
  GLFWgammaramp *handle_00;
  void *__ptr;
  float in_XMM0_Da;
  float fVar1;
  float value;
  GLFWgammaramp *original;
  GLFWgammaramp ramp;
  unsigned_short *values;
  uint i;
  undefined4 in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  uint local_10;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if ((in_XMM0_Da <= 0.0) || (3.4028235e+38 < in_XMM0_Da)) {
    _glfwInputError((int)(double)in_XMM0_Da,(char *)0x10004,"Invalid gamma value %f");
  }
  else {
    handle_00 = glfwGetGammaRamp((GLFWmonitor *)
                                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (handle_00 != (GLFWgammaramp *)0x0) {
      __ptr = calloc((ulong)handle_00->size,2);
      for (local_10 = 0; local_10 < handle_00->size; local_10 = local_10 + 1) {
        fVar1 = powf((float)local_10 / (float)(handle_00->size - 1),1.0 / in_XMM0_Da);
        in_stack_ffffffffffffffbc = _glfw_fminf(fVar1 * 65535.0 + 0.5,65535.0);
        *(short *)((long)__ptr + (ulong)local_10 * 2) = (short)(int)in_stack_ffffffffffffffbc;
      }
      glfwSetGammaRamp((GLFWmonitor *)handle_00,
                       (GLFWgammaramp *)
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      free(__ptr);
    }
  }
  return;
}

Assistant:

GLFWAPI void glfwSetGamma(GLFWmonitor* handle, float gamma)
{
    unsigned int i;
    unsigned short* values;
    GLFWgammaramp ramp;
    const GLFWgammaramp* original;
    assert(handle != NULL);
    assert(gamma > 0.f);
    assert(gamma <= FLT_MAX);

    _GLFW_REQUIRE_INIT();

    if (gamma != gamma || gamma <= 0.f || gamma > FLT_MAX)
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Invalid gamma value %f", gamma);
        return;
    }

    original = glfwGetGammaRamp(handle);
    if (!original)
        return;

    values = calloc(original->size, sizeof(unsigned short));

    for (i = 0;  i < original->size;  i++)
    {
        float value;

        // Calculate intensity
        value = i / (float) (original->size - 1);
        // Apply gamma curve
        value = powf(value, 1.f / gamma) * 65535.f + 0.5f;
        // Clamp to value range
        value = _glfw_fminf(value, 65535.f);

        values[i] = (unsigned short) value;
    }

    ramp.red = values;
    ramp.green = values;
    ramp.blue = values;
    ramp.size = original->size;

    glfwSetGammaRamp(handle, &ramp);
    free(values);
}